

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O0

void __thiscall msgpack11::MsgPack::MsgPack(MsgPack *this,int32_t value)

{
  shared_ptr<msgpack11::MsgPackInt32> local_28;
  int32_t local_14;
  MsgPack *pMStack_10;
  int32_t value_local;
  MsgPack *this_local;
  
  local_14 = value;
  pMStack_10 = this;
  std::make_shared<msgpack11::MsgPackInt32,int&>((int *)&local_28);
  std::shared_ptr<msgpack11::MsgPackValue>::shared_ptr<msgpack11::MsgPackInt32,void>
            (&this->m_ptr,&local_28);
  std::shared_ptr<msgpack11::MsgPackInt32>::~shared_ptr(&local_28);
  return;
}

Assistant:

MsgPack::MsgPack(int32_t value)                    : m_ptr(make_shared<MsgPackInt32>(value)) {}